

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void __thiscall QMakeEvaluator::evaluateCommand(QMakeEvaluator *this,QString *cmds,QString *where)

{
  long lVar1;
  QStringView contents;
  bool bVar2;
  ProFile *this_00;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  Location LVar3;
  ProFile *pro;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff7c;
  QMakeEvaluator *in_stack_ffffffffffffff80;
  QString *in_stack_ffffffffffffff88;
  QStringView *in_stack_ffffffffffffff90;
  QString *name;
  QMakeParser *in_stack_ffffffffffffffa8;
  qsizetype qVar5;
  storage_type_conflict *in_stack_ffffffffffffffc8;
  SubGrammar in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar5 = in_RDI;
  bVar2 = QString::isEmpty((QString *)0x2fb41f);
  if (!bVar2) {
    name = *(QString **)(in_RDI + 0x298);
    QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    uVar4 = 0;
    contents.m_data = in_stack_ffffffffffffffc8;
    contents.m_size = qVar5;
    this_00 = QMakeParser::parsedProBlock
                        (in_stack_ffffffffffffffa8,contents,(int)((ulong)in_RDI >> 0x20),name,
                         (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffffe0);
    bVar2 = ProFile::isOk(this_00);
    if (bVar2) {
      QStack<QMakeEvaluator::Location>::push
                ((QStack<QMakeEvaluator::Location> *)in_stack_ffffffffffffff80,
                 (Location *)CONCAT44(in_stack_ffffffffffffff7c,uVar4));
      ProFile::tokPtr((ProFile *)0x2fb4ad);
      visitProBlock(in_stack_ffffffffffffff80,(ProFile *)CONCAT44(in_stack_ffffffffffffff7c,uVar4),
                    (ushort *)0x2fb4bf);
      LVar3 = QStack<QMakeEvaluator::Location>::pop((QStack<QMakeEvaluator::Location> *)this_00);
      *(ProFile **)(in_RDI + 0x10) = LVar3.pro;
      *(ushort *)(in_RDI + 0x18) = LVar3.line;
    }
    ProFile::deref((ProFile *)in_stack_ffffffffffffff80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeEvaluator::evaluateCommand(const QString &cmds, const QString &where)
{
    if (!cmds.isEmpty()) {
        ProFile *pro = m_parser->parsedProBlock(QStringView(cmds), 0, where, -1);
        if (pro->isOk()) {
            m_locationStack.push(m_current);
            visitProBlock(pro, pro->tokPtr());
            m_current = m_locationStack.pop();
        }
        pro->deref();
    }
}